

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::debug_log(torrent *this,char *fmt,...)

{
  _Atomic_word *p_Var1;
  char in_AL;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  __uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
  in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM3_Qa;
  element_type *in_XMM4_Qa;
  int64_t in_XMM5_Qa;
  int64_t in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list v;
  undefined1 local_110 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 *local_e8;
  undefined1 local_c8 [16];
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  local_b8;
  peer_class_set local_b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_68;
  element_type *local_58;
  int64_t local_48;
  int64_t local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_b0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._20_8_ = in_XMM0_Qa;
    local_b0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._36_8_ = in_XMM1_Qa;
    local_b0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._52_8_ = in_XMM2_Qa;
    local_68._M_pi = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_110._16_8_ = fmt;
  local_b8._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
       (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
       (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
       in_RDX.
       super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
       .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  local_b0._0_8_ = in_RCX;
  local_b0.m_class.
  super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
  ._M_elems._4_8_ = in_R8;
  local_b0.m_class.
  super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
  ._M_elems._12_8_ = in_R9;
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) >> 0xe & 1) != 0) {
    local_e8 = local_c8;
    local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0x00000008;
    local_110._24_8_ = (element_type *)0x3000000010;
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_110);
    alert_manager::
    emplace_alert<libtorrent::torrent_log_alert,libtorrent::torrent_handle,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_110,
               (char **)(local_110 + 0x10),(__va_list_tag (*) [1])(local_110 + 0x18));
    if ((piece_picker *)local_110._8_8_ != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_110._8_8_ + 0xc);
        iVar2 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar2 = *(_Atomic_word *)(local_110._8_8_ + 0xc);
        *(int *)(local_110._8_8_ + 0xc) = iVar2 + -1;
      }
      if (iVar2 == 1) {
        (*(*(_func_int ***)local_110._8_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void torrent::debug_log(char const* fmt, ...) const noexcept try
	{
		if (!alerts().should_post<torrent_log_alert>()) return;

		va_list v;
		va_start(v, fmt);
		alerts().emplace_alert<torrent_log_alert>(
			const_cast<torrent*>(this)->get_handle(), fmt, v);
		va_end(v);
	}
	catch (std::exception const&) {}